

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringStd.cpp
# Opt level: O0

void testStringStd(int iterations)

{
  __type _Var1;
  int iVar2;
  long lVar3;
  string *local_170;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  int local_9c;
  undefined1 local_97;
  allocator<char> local_96;
  allocator<char> local_95;
  int i;
  allocator<char> local_81;
  string *local_80;
  string local_78 [8];
  string blah [3];
  size_t val;
  int iterations_local;
  
  srand(100);
  blah[2].field_2._8_8_ = 0;
  local_97 = 1;
  local_80 = local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678",
             &local_81);
  local_80 = (string *)(blah[0].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(blah[0].field_2._M_local_buf + 8),
             "12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688",
             &local_95);
  local_80 = (string *)(blah[1].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(blah[1].field_2._M_local_buf + 8),
             "12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698",
             &local_96);
  local_97 = 0;
  std::allocator<char>::~allocator(&local_96);
  std::allocator<char>::~allocator(&local_95);
  std::allocator<char>::~allocator(&local_81);
  for (local_9c = 0; local_9c < iterations; local_9c = local_9c + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,
               "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678",
               &local_c1);
    iVar2 = rand();
    _Var1 = std::operator==(&local_c0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&blah[(long)(iVar2 % 3) + -1].field_2 + 8));
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    if (_Var1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,
                 "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678",
                 &local_109);
      iVar2 = rand();
      std::operator+(&local_e8,&local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&blah[(long)(iVar2 % 3) + -1].field_2 + 8));
      lVar3 = std::__cxx11::string::length();
      blah[2].field_2._8_8_ = lVar3 + blah[2].field_2._8_8_;
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator(&local_109);
    }
  }
  local_170 = (string *)(blah[2].field_2._M_local_buf + 8);
  do {
    local_170 = local_170 + -0x20;
    std::__cxx11::string::~string(local_170);
  } while (local_170 != local_78);
  return;
}

Assistant:

void testStringStd(int iterations)
{
  srand(100);
  size_t val = 0;
  std::string blah[] = {
    "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678",
    "12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688",
    "12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698"
  };
  for (int i = 0; i < iterations; ++i)
  {
    if(std::string("12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678") == blah[rand() % 3])
      val += (std::string("12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678") + blah[rand() % 3]).length();
  }
}